

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmsio.c
# Opt level: O2

int FmsIOGetInt(FmsIOContext *ctx,char *path,FmsInt *value)

{
  int iVar1;
  ulonglong uVar2;
  int *piVar3;
  int iVar4;
  char v [512];
  char k [512];
  
  if (ctx != (FmsIOContext *)0x0) {
    if (path == (char *)0x0) {
      iVar1 = 2;
    }
    else if (value == (FmsInt *)0x0) {
      iVar1 = 3;
    }
    else {
      iVar1 = FmsIOReadKeyValue(ctx,k,v);
      if (iVar1 == 0) {
        iVar1 = strcmp(k,path);
        if (iVar1 == 0) {
          uVar2 = strtoull(v,(char **)0x0,10);
          *value = uVar2;
          piVar3 = __errno_location();
          iVar4 = 7;
          if (*piVar3 != 0x16) {
            iVar4 = 0;
          }
          iVar1 = 6;
          if (*piVar3 != 0x22) {
            iVar1 = iVar4;
          }
        }
        else {
          iVar1 = 5;
        }
      }
      else {
        iVar1 = 4;
      }
    }
    return iVar1;
  }
  return 1;
}

Assistant:

static int
FmsIOGetInt(FmsIOContext *ctx, const char *path, FmsInt *value) {
  char k[FMS_BUFFER_SIZE], v[FMS_BUFFER_SIZE];
  if(!ctx) E_RETURN(1);
  if(!path) E_RETURN(2);
  if(!value) E_RETURN(3);

  // Error reading line
  if(FmsIOReadKeyValue(ctx, k, v))
    E_RETURN(4);

  // Path & key do not match
  if(strcmp(k, path))
    E_RETURN(5);

  *value = StrToFmsInt(v, NULL, 10);

  // Potential errors
  if (errno == ERANGE) { E_RETURN(6); }
  if (errno == EINVAL) { E_RETURN(7); }

  return 0;
}